

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitGlobalSet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,GlobalSet *curr)

{
  string_view name;
  SmallVector<wasm::Literal,_1UL> *this_00;
  undefined1 local_78 [8];
  Flow flow;
  
  name = (curr->name).super_IString.str;
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_78,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->value);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    this_00 = &getGlobal(this,(Name)name)->super_SmallVector<wasm::Literal,_1UL>;
    SmallVector<wasm::Literal,_1UL>::operator=(this_00,(SmallVector<wasm::Literal,_1UL> *)local_78);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                      _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_78);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

Flow visitGlobalSet(GlobalSet* curr) {
    NOTE_ENTER("GlobalSet");
    auto name = curr->name;
    Flow flow = self()->visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(name);
    NOTE_EVAL1(flow.getSingleValue());

    getGlobal(name) = flow.values;
    return Flow();
  }